

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O1

vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
* myvk::PhysicalDevice::Fetch
            (vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
             *__return_storage_ptr__,Ptr<Instance> *instance)

{
  undefined8 *puVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  PhysicalDevice *pPVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  ulong uVar6;
  uint32_t device_count;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> devices;
  uint32_t local_60;
  undefined1 local_59;
  PhysicalDevice *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> local_48;
  
  local_60 = 0;
  (*vkEnumeratePhysicalDevices)
            (((instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_instance,&local_60,(VkPhysicalDevice *)0x0);
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::vector
            (&local_48,(ulong)local_60,(allocator_type *)&local_58);
  (*vkEnumeratePhysicalDevices)
            (((instance->super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_instance,&local_60,
             local_48.
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_start);
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
  ::resize(__return_storage_ptr__,(ulong)local_60);
  if (local_60 != 0) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      local_58 = (PhysicalDevice *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<myvk::PhysicalDevice,std::allocator<myvk::PhysicalDevice>,std::shared_ptr<myvk::Instance>const&,VkPhysicalDevice_T*&>
                (&_Stack_50,&local_58,(allocator<myvk::PhysicalDevice> *)&local_59,instance,
                 (VkPhysicalDevice_T **)
                 ((long)local_48.
                        super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5));
      std::__shared_ptr<myvk::PhysicalDevice,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<myvk::PhysicalDevice,myvk::PhysicalDevice>
                ((__shared_ptr<myvk::PhysicalDevice,(__gnu_cxx::_Lock_policy)2> *)&local_58,local_58
                );
      _Var4._M_pi = _Stack_50._M_pi;
      pPVar3 = local_58;
      psVar2 = (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<myvk::PhysicalDevice>,_std::allocator<std::shared_ptr<myvk::PhysicalDevice>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_58 = (PhysicalDevice *)0x0;
      _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(psVar2->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>)
                      ._M_refcount._M_pi + lVar5 * 2);
      puVar1 = (undefined8 *)
               ((long)&(psVar2->super___shared_ptr<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr + lVar5 * 2);
      *puVar1 = pPVar3;
      puVar1[1] = _Var4._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (uVar6 < local_60);
  }
  if (local_48.super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (VkPhysicalDevice *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ptr<PhysicalDevice>> PhysicalDevice::Fetch(const Ptr<Instance> &instance) {
	uint32_t device_count = 0;
	vkEnumeratePhysicalDevices(instance->GetHandle(), &device_count, nullptr);
	std::vector<VkPhysicalDevice> devices(device_count);
	vkEnumeratePhysicalDevices(instance->GetHandle(), &device_count, devices.data());

	std::vector<Ptr<PhysicalDevice>> ret;
	ret.resize(device_count);
	for (uint32_t i = 0; i < device_count; ++i) {
		ret[i] = std::make_shared<PhysicalDevice>(instance, devices[i]);
	}
	return ret;
}